

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Module * codegen(Module *__return_storage_ptr__,Module *irModule)

{
  Stats local_e8;
  Module local_e0;
  Stats local_90;
  Module local_88;
  Stats local_38 [3];
  undefined1 local_19;
  Module *local_18;
  Module *irModule_local;
  Module *res;
  
  local_19 = 0;
  local_18 = irModule;
  irModule_local = (Module *)__return_storage_ptr__;
  mocker::runInstructionSelection(__return_storage_ptr__,irModule);
  std::operator<<((ostream *)&std::cerr,"\nNASM:\n");
  std::operator<<((ostream *)&std::cerr,"After instruction selection:\n");
  mocker::nasm::Stats::Stats(local_38,__return_storage_ptr__);
  printNasmStats(local_38);
  mocker::allocateRegisters(&local_88,__return_storage_ptr__);
  mocker::nasm::Module::operator=(__return_storage_ptr__,&local_88);
  mocker::nasm::Module::~Module(&local_88);
  std::operator<<((ostream *)&std::cerr,"\nAfter register allocation:\n");
  mocker::nasm::Stats::Stats(&local_90,__return_storage_ptr__);
  printNasmStats(&local_90);
  mocker::runPeepholeOptimization(&local_e0,__return_storage_ptr__);
  mocker::nasm::Module::operator=(__return_storage_ptr__,&local_e0);
  mocker::nasm::Module::~Module(&local_e0);
  std::operator<<((ostream *)&std::cerr,"\nAfter peephole optimization:\n");
  mocker::nasm::Stats::Stats(&local_e8,__return_storage_ptr__);
  printNasmStats(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

mocker::nasm::Module codegen(const mocker::ir::Module &irModule) {
  using namespace mocker;
  auto res = runInstructionSelection(irModule);
  //  nasm::printModule(res);

  std::cerr << "\nNASM:\n";
  std::cerr << "After instruction selection:\n";
  printNasmStats(nasm::Stats(res));

  res = allocateRegisters(res);
  //  res = allocateRegistersNaively(res);
  std::cerr << "\nAfter register allocation:\n";
  printNasmStats(nasm::Stats(res));

  //  nasm::printModule(res, std::cerr);

  res = runPeepholeOptimization(res);
  std::cerr << "\nAfter peephole optimization:\n";
  printNasmStats(nasm::Stats(res));
  return res;
}